

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spbcgs_serial.c
# Opt level: O0

int check_vector(N_Vector X,N_Vector Y,sunrealtype tol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunrealtype maxerr;
  sunrealtype *Ydata;
  sunrealtype *Xdata;
  sunindextype i;
  int failure;
  double local_50;
  double local_48;
  long local_30;
  int local_24;
  int local_4;
  
  local_24 = 0;
  lVar2 = N_VGetArrayPointer(in_RDI);
  lVar3 = N_VGetArrayPointer(in_RSI);
  for (local_30 = 0; local_30 < problem_size; local_30 = local_30 + 1) {
    iVar1 = SUNRCompareTol(*(undefined8 *)(lVar2 + local_30 * 8),
                           *(undefined8 *)(lVar3 + local_30 * 8),(int)in_XMM0_Qa);
    local_24 = iVar1 + local_24;
  }
  if ((double)local_24 <= 0.0) {
    local_4 = 0;
  }
  else {
    local_48 = 0.0;
    for (local_30 = 0; local_30 < problem_size; local_30 = local_30 + 1) {
      if (ABS(*(double *)(lVar2 + local_30 * 8) - *(double *)(lVar3 + local_30 * 8)) /
          ABS(*(double *)(lVar2 + local_30 * 8)) <= local_48) {
        local_50 = local_48;
      }
      else {
        local_50 = ABS(*(double *)(lVar2 + local_30 * 8) - *(double *)(lVar3 + local_30 * 8)) /
                   ABS(*(double *)(lVar2 + local_30 * 8));
      }
      local_48 = local_50;
    }
    printf("check err failure: maxerr = %g (tol = %g)\n",local_48,in_XMM0_Qa);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, sunrealtype tol)
{
  int failure = 0;
  sunindextype i;
  sunrealtype *Xdata, *Ydata, maxerr;

  Xdata = N_VGetArrayPointer(X);
  Ydata = N_VGetArrayPointer(Y);

  /* check vector data */
  for (i = 0; i < problem_size; i++)
  {
    failure += SUNRCompareTol(Xdata[i], Ydata[i], tol);
  }

  if (failure > ZERO)
  {
    maxerr = ZERO;
    for (i = 0; i < problem_size; i++)
    {
      maxerr = SUNMAX(SUNRabs(Xdata[i] - Ydata[i]) / SUNRabs(Xdata[i]), maxerr);
    }
    printf("check err failure: maxerr = %" GSYM " (tol = %" GSYM ")\n", maxerr,
           tol);
    return (1);
  }
  else { return (0); }
}